

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::RelationalComparisonHelper
               (Var aLeft,Var aRight,ScriptContext *scriptContext,bool leftFirst,bool undefinedAs)

{
  Type TVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  uint uVar7;
  undefined4 *puVar8;
  RecyclableObject *pRVar9;
  JavascriptTypedNumber<unsigned_long> *pJVar10;
  JavascriptTypedNumber<long> *pJVar11;
  ulong uVar12;
  Type TVar13;
  Type TVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  double value;
  undefined1 auVar18 [16];
  int local_58;
  double local_38;
  
LAB_00ab3102:
  if ((undefined1 *)aLeft == (undefined1 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00ab40ac;
    *puVar8 = 0;
  }
  if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00ab40ac;
    *puVar8 = 0;
  }
  TVar14 = TypeIds_FirstNumberType;
  if ((((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) &&
     (TVar14 = TypeIds_Number, aLeft < (undefined1 *)0x4000000000000)) {
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00ab40ac;
      *puVar8 = 0;
    }
    TVar14 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar14) && (BVar6 = RecyclableObject::IsExternal(pRVar9), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00ab40ac;
      *puVar8 = 0;
    }
  }
  if (TVar14 == TypeIds_Undefined) {
    aLeft = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
            super_JavascriptLibraryBase).nan.ptr;
  }
  else if (TVar14 == TypeIds_Null) {
    aLeft = &DAT_1000000000000;
  }
  if ((undefined1 *)aRight == (undefined1 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00ab40ac;
    *puVar8 = 0;
  }
  if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00ab40ac;
    *puVar8 = 0;
  }
  TVar14 = TypeIds_FirstNumberType;
  if ((((ulong)aRight & 0xffff000000000000) != 0x1000000000000) &&
     (TVar14 = TypeIds_Number, aRight < (undefined1 *)0x4000000000000)) {
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00ab40ac;
      *puVar8 = 0;
    }
    TVar14 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar14) && (BVar6 = RecyclableObject::IsExternal(pRVar9), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00ab40ac;
      *puVar8 = 0;
    }
  }
  if (TVar14 == TypeIds_Undefined) {
    aRight = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).nan.ptr;
  }
  else if (TVar14 == TypeIds_Null) {
    aRight = &DAT_1000000000000;
  }
  if ((undefined1 *)aLeft == (undefined1 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00ab40ac;
    *puVar8 = 0;
  }
  uVar12 = (ulong)aLeft & 0xffff000000000000;
  bVar16 = ((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000;
  bVar4 = bVar16 && uVar12 == 0x1000000000000;
  if (bVar16 && uVar12 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar16 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                 ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                 "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar16) goto LAB_00ab40ac;
    *puVar8 = 0;
  }
  TVar14 = TypeIds_FirstNumberType;
  if ((uVar12 != 0x1000000000000) &&
     (TVar14 = TypeIds_Number, aLeft < (undefined1 *)0x4000000000000)) {
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar16 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                   ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar16) goto LAB_00ab40ac;
      *puVar8 = 0;
    }
    TVar14 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar14) && (BVar6 = RecyclableObject::IsExternal(pRVar9), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar16 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                   ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                   "GetTypeId aValue has invalid TypeId");
      if (!bVar16) goto LAB_00ab40ac;
      *puVar8 = 0;
    }
  }
  if ((undefined1 *)aRight == (undefined1 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar16 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                 ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar16) goto LAB_00ab40ac;
    *puVar8 = 0;
  }
  uVar15 = (ulong)aRight & 0xffff000000000000;
  bVar16 = uVar15 == 0x1000000000000;
  bVar17 = ((ulong)aRight & 0x1ffff00000000) != 0x1000000000000;
  if (bVar17 && bVar16) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar5) goto LAB_00ab40ac;
    *puVar8 = 0;
  }
  TVar13 = TypeIds_FirstNumberType;
  if ((uVar15 != 0x1000000000000) &&
     (TVar13 = TypeIds_Number, aRight < (undefined1 *)0x4000000000000)) {
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00ab40ac;
      *puVar8 = 0;
    }
    TVar13 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar13) && (BVar6 = RecyclableObject::IsExternal(pRVar9), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar5) goto LAB_00ab40ac;
      *puVar8 = 0;
    }
  }
  if ((TVar14 == TypeIds_BigInt) || (TVar13 == TypeIds_BigInt)) {
    if (TVar14 != TVar13) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x28c,"(leftType == rightType)",
                                  "do not support comparison with types other than BigInt");
      if (!bVar4) goto LAB_00ab40ac;
      *puVar8 = 0;
    }
    bVar4 = JavascriptBigInt::LessThan(aLeft,aRight);
    goto LAB_00ab3ab5;
  }
  local_58 = (int)aLeft;
  switch(TVar14) {
  case TypeIds_Undefined:
  case TypeIds_Null:
  case TypeIds_Boolean:
  case TypeIds_Symbol:
    goto switchD_00ab39a6_caseD_0;
  case TypeIds_FirstNumberType:
    value = (double)local_58;
    break;
  case TypeIds_Number:
    if (aLeft < (undefined1 *)0x4000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar4) goto LAB_00ab40ac;
      *puVar8 = 0;
    }
    value = (double)((ulong)aLeft ^ 0xfffc000000000000);
    break;
  case TypeIds_Int64Number:
    if (TVar13 == TypeIds_LastNumberType) {
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
      lVar2 = pJVar11->m_value;
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      bVar4 = lVar2 < (long)pJVar10->m_value;
      if ((-1 < lVar2) && (pJVar10->m_value >> 0x1f == 0)) {
LAB_00ab3f34:
        return (uint)bVar4;
      }
    }
    else if (TVar13 == TypeIds_Int64Number) {
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
      lVar2 = pJVar11->m_value;
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
      return (uint)(lVar2 < pJVar11->m_value);
    }
    pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
    value = (double)pJVar11->m_value;
    goto LAB_00ab3f4d;
  case TypeIds_LastNumberType:
    if (TVar13 == TypeIds_LastNumberType) {
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      uVar12 = pJVar10->m_value;
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      return (uint)(uVar12 < pJVar10->m_value);
    }
    if (TVar13 == TypeIds_Int64Number) {
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      uVar12 = pJVar10->m_value;
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
      bVar4 = (long)uVar12 < pJVar11->m_value;
      if ((uVar12 < 0x7fffffff) && (-1 < pJVar11->m_value)) goto LAB_00ab3f34;
    }
    pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
    TVar1 = pJVar10->m_value;
    if (bVar17 && bVar16) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00ab40ac;
      *puVar8 = 0;
    }
    auVar18._0_8_ = (double)CONCAT44(0x43300000,(int)TVar1);
    auVar18._8_4_ = (int)(TVar1 >> 0x20);
    auVar18._12_4_ = 0x45300000;
    value = (auVar18._0_8_ - 4503599627370496.0) + (auVar18._8_8_ - 1.9342813113834067e+25);
    goto LAB_00ab3fba;
  case TypeIds_String:
    if (2 < TVar13 - TypeIds_Boolean) {
      if (TVar13 != TypeIds_String) {
        aRight = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aRight,scriptContext);
        if ((undefined1 *)aRight == (undefined1 *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar16 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                       ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
          if (!bVar16) goto LAB_00ab40ac;
          *puVar8 = 0;
        }
        bVar16 = TaggedInt::Is(aRight);
        TVar14 = TypeIds_FirstNumberType;
        if ((!bVar16) && (TVar14 = TypeIds_Number, aRight < (undefined1 *)0x4000000000000)) {
          pRVar9 = UnsafeVarTo<Js::RecyclableObject>(aRight);
          if (pRVar9 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar16 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar16) goto LAB_00ab40ac;
            *puVar8 = 0;
          }
          TVar14 = ((pRVar9->type).ptr)->typeId;
          if ((0x57 < (int)TVar14) && (BVar6 = RecyclableObject::IsExternal(pRVar9), BVar6 == 0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar16 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                         ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                         "GetTypeId aValue has invalid TypeId");
            if (!bVar16) goto LAB_00ab40ac;
            *puVar8 = 0;
          }
        }
        if (TVar14 != TypeIds_String) {
          JavascriptConversion::ToNumber(aRight,scriptContext);
          goto LAB_00ab3c62;
        }
      }
      bVar4 = JavascriptString::LessThan(aLeft,aRight);
LAB_00ab3ab5:
      return (uint)bVar4;
    }
LAB_00ab3c62:
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00ab40ac;
      *puVar8 = 0;
    }
    if (uVar12 == 0x1000000000000) {
      value = (double)local_58;
    }
    else if (aLeft < (undefined1 *)0x4000000000000) {
      value = JavascriptConversion::ToNumber_Full(aLeft,scriptContext);
    }
    else {
      value = (double)((ulong)aLeft ^ 0xfffc000000000000);
    }
    uVar15 = (ulong)aRight & 0xffff000000000000;
    if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 || uVar15 != 0x1000000000000)
    goto LAB_00ab3fba;
    goto LAB_00ab3f5c;
  default:
    goto switchD_00ab39a6_default;
  }
  if (TVar13 == TypeIds_Number) {
    local_38 = JavascriptNumber::GetValue(aRight);
  }
  else {
    if (TVar13 == TypeIds_FirstNumberType) goto LAB_00ab3fbf;
    local_38 = JavascriptConversion::ToNumber(aRight,scriptContext);
  }
  goto LAB_00ab400b;
switchD_00ab39a6_default:
  if (leftFirst) {
    aLeft = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aLeft,scriptContext);
    aRight = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aRight,scriptContext);
  }
  else {
    aRight = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aRight,scriptContext);
    aLeft = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aLeft,scriptContext);
  }
  goto LAB_00ab3102;
switchD_00ab39a6_caseD_0:
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00ab40ac;
    *puVar8 = 0;
  }
  if (uVar12 == 0x1000000000000) {
    value = (double)local_58;
  }
  else if (aLeft < (undefined1 *)0x4000000000000) {
    value = JavascriptConversion::ToNumber_Full(aLeft,scriptContext);
  }
  else {
    value = (double)((ulong)aLeft ^ 0xfffc000000000000);
  }
LAB_00ab3f4d:
  if (bVar17 && bVar16) {
LAB_00ab3f5c:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) {
LAB_00ab40ac:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
LAB_00ab3fba:
  if (uVar15 == 0x1000000000000) {
LAB_00ab3fbf:
    local_38 = (double)(int)aRight;
  }
  else if (aRight < (undefined1 *)0x4000000000000) {
    local_38 = JavascriptConversion::ToNumber_Full(aRight,scriptContext);
  }
  else {
    local_38 = (double)((ulong)aRight ^ 0xfffc000000000000);
  }
LAB_00ab400b:
  bVar4 = NumberUtilities::IsNan(value);
  if ((bVar4) || (bVar4 = NumberUtilities::IsNan(local_38), bVar4)) {
    uVar7 = (uint)undefinedAs;
  }
  else {
    uVar7 = 0;
    if ((value != local_38) || (NAN(value) || NAN(local_38))) {
      uVar7 = (uint)(value < local_38);
    }
  }
  return uVar7;
}

Assistant:

BOOL JavascriptOperators::RelationalComparisonHelper(Var aLeft, Var aRight, ScriptContext* scriptContext, bool leftFirst, bool undefinedAs)
    {
        TypeId typeId = JavascriptOperators::GetTypeId(aLeft);

        if (typeId == TypeIds_Null)
        {
            aLeft=TaggedInt::ToVarUnchecked(0);
        }
        else if (typeId == TypeIds_Undefined)
        {
            aLeft=scriptContext->GetLibrary()->GetNaN();
        }

        typeId = JavascriptOperators::GetTypeId(aRight);

        if (typeId == TypeIds_Null)
        {
            aRight=TaggedInt::ToVarUnchecked(0);
        }
        else if (typeId == TypeIds_Undefined)
        {
            aRight=scriptContext->GetLibrary()->GetNaN();
        }

        double dblLeft, dblRight;
        TypeId leftType = JavascriptOperators::GetTypeId(aLeft);
        TypeId rightType = JavascriptOperators::GetTypeId(aRight);

        if ((leftType == TypeIds_BigInt) || (rightType == TypeIds_BigInt))
        {
            // TODO: support comparison with types other than BigInt
            AssertOrFailFastMsg(leftType == rightType, "do not support comparison with types other than BigInt");
            return JavascriptBigInt::LessThan(aLeft, aRight);
        }

        switch (leftType)
        {
        case TypeIds_Integer:
            dblLeft = TaggedInt::ToDouble(aLeft);
            switch (rightType)
            {
            case TypeIds_Integer:
                dblRight = TaggedInt::ToDouble(aRight);
                break;
            case TypeIds_Number:
                dblRight = JavascriptNumber::GetValue(aRight);
                break;
            default:
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
                break;
            }
            break;
        case TypeIds_Number:
            dblLeft = JavascriptNumber::GetValue(aLeft);
            switch (rightType)
            {
            case TypeIds_Integer:
                dblRight = TaggedInt::ToDouble(aRight);
                break;
            case TypeIds_Number:
                dblRight = JavascriptNumber::GetValue(aRight);
                break;
            default:
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
                break;
            }
            break;
        case TypeIds_Int64Number:
            {
                switch (rightType)
                {
                case TypeIds_Int64Number:
                    {
                        __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                        __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                        return leftValue < rightValue;
                    }
                    break;
                case TypeIds_UInt64Number:
                    {
                        __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                        unsigned __int64 rightValue = UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                        if (rightValue <= INT_MAX && leftValue >= 0)
                        {
                            return leftValue < (__int64)rightValue;
                        }
                    }
                    break;
                }
                dblLeft = (double)UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            }
            break;

        // we cannot do double conversion between 2 int64 numbers as we can get wrong result after conversion
        // i.e., two different numbers become the same after losing precision. We'll continue dbl comparison
        // if either number is not an int64 number.
        case TypeIds_UInt64Number:
            {
                switch (rightType)
                {
                case TypeIds_Int64Number:
                    {
                        unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                        __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                        if (leftValue < INT_MAX && rightValue >= 0)
                        {
                            return (__int64)leftValue < rightValue;
                        }
                    }
                    break;
                case TypeIds_UInt64Number:
                    {
                        unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                        unsigned __int64 rightValue = UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                        return leftValue < rightValue;
                    }
                    break;
                }
                dblLeft = (double)UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            }
            break;

        case TypeIds_String:
            switch (rightType)
            {
            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_Boolean:
                break;
            default:
                aRight = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);
                rightType = JavascriptOperators::GetTypeId(aRight);
                if (rightType != TypeIds_String)
                {
                    dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
                    break;
                }
            case TypeIds_String:
                return JavascriptString::LessThan(aLeft, aRight);
            }
            dblLeft = JavascriptConversion::ToNumber(aLeft, scriptContext);
            dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            break;
        case TypeIds_Boolean:
        case TypeIds_Null:
        case TypeIds_Undefined:
        case TypeIds_Symbol:
            dblLeft = JavascriptConversion::ToNumber(aLeft, scriptContext);
            dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            break;
        default:
            if (leftFirst)
            {
                aLeft = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aLeft, scriptContext);
                aRight = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);
            }
            else
            {
                aRight = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);
                aLeft = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aLeft, scriptContext);
            }
            //BugFix: When @@ToPrimitive of an object is overridden with a function that returns null/undefined
            //this helper will fall into a inescapable goto loop as the checks for null/undefined were outside of the path
            return RelationalComparisonHelper(aLeft, aRight, scriptContext, leftFirst, undefinedAs);
        }

        //
        // And +0,-0 that is not implemented fully
        //

        if (JavascriptNumber::IsNan(dblLeft) || JavascriptNumber::IsNan(dblRight))
        {
            return undefinedAs;
        }

        // this will succeed for -0.0 == 0.0 case as well
        if (dblLeft == dblRight)
        {
            return false;
        }

        return dblLeft < dblRight;
    }